

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

bool slang::syntax::SequenceExprSyntax::isKind(SyntaxKind kind)

{
  bool local_9;
  SyntaxKind kind_local;
  
  if (((((kind == AndSequenceExpr) || (kind == BinaryEventExpression)) ||
       (kind == ClockingSequenceExpr)) ||
      (((kind == DelayedSequenceExpr || (kind == FirstMatchSequenceExpr)) ||
       ((kind == IntersectSequenceExpr ||
        ((kind == OrSequenceExpr || (kind == ParenthesizedEventExpression)))))))) ||
     ((kind == ParenthesizedSequenceExpr ||
      ((((kind == SignalEventExpression || (kind == SimpleSequenceExpr)) ||
        (kind == ThroughoutSequenceExpr)) || (kind == WithinSequenceExpr)))))) {
    local_9 = true;
  }
  else {
    local_9 = false;
  }
  return local_9;
}

Assistant:

bool SequenceExprSyntax::isKind(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::AndSequenceExpr:
        case SyntaxKind::BinaryEventExpression:
        case SyntaxKind::ClockingSequenceExpr:
        case SyntaxKind::DelayedSequenceExpr:
        case SyntaxKind::FirstMatchSequenceExpr:
        case SyntaxKind::IntersectSequenceExpr:
        case SyntaxKind::OrSequenceExpr:
        case SyntaxKind::ParenthesizedEventExpression:
        case SyntaxKind::ParenthesizedSequenceExpr:
        case SyntaxKind::SignalEventExpression:
        case SyntaxKind::SimpleSequenceExpr:
        case SyntaxKind::ThroughoutSequenceExpr:
        case SyntaxKind::WithinSequenceExpr:
            return true;
        default:
            return false;
    }
}